

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_SINCOS(Context *ctx)

{
  int iVar1;
  char *fmt;
  size_t in_R8;
  char code [128];
  char src0 [64];
  char local_d8 [200];
  
  iVar1 = (ctx->dest_arg).writemask;
  make_METAL_srcarg_string(ctx,0,1,local_d8 + 0x80,in_R8);
  local_d8[0x70] = '\0';
  local_d8[0x71] = '\0';
  local_d8[0x72] = '\0';
  local_d8[0x73] = '\0';
  local_d8[0x74] = '\0';
  local_d8[0x75] = '\0';
  local_d8[0x76] = '\0';
  local_d8[0x77] = '\0';
  local_d8[0x78] = '\0';
  local_d8[0x79] = '\0';
  local_d8[0x7a] = '\0';
  local_d8[0x7b] = '\0';
  local_d8[0x7c] = '\0';
  local_d8[0x7d] = '\0';
  local_d8[0x7e] = '\0';
  local_d8[0x7f] = '\0';
  local_d8[0x60] = '\0';
  local_d8[0x61] = '\0';
  local_d8[0x62] = '\0';
  local_d8[99] = '\0';
  local_d8[100] = '\0';
  local_d8[0x65] = '\0';
  local_d8[0x66] = '\0';
  local_d8[0x67] = '\0';
  local_d8[0x68] = '\0';
  local_d8[0x69] = '\0';
  local_d8[0x6a] = '\0';
  local_d8[0x6b] = '\0';
  local_d8[0x6c] = '\0';
  local_d8[0x6d] = '\0';
  local_d8[0x6e] = '\0';
  local_d8[0x6f] = '\0';
  local_d8[0x50] = '\0';
  local_d8[0x51] = '\0';
  local_d8[0x52] = '\0';
  local_d8[0x53] = '\0';
  local_d8[0x54] = '\0';
  local_d8[0x55] = '\0';
  local_d8[0x56] = '\0';
  local_d8[0x57] = '\0';
  local_d8[0x58] = '\0';
  local_d8[0x59] = '\0';
  local_d8[0x5a] = '\0';
  local_d8[0x5b] = '\0';
  local_d8[0x5c] = '\0';
  local_d8[0x5d] = '\0';
  local_d8[0x5e] = '\0';
  local_d8[0x5f] = '\0';
  local_d8[0x40] = '\0';
  local_d8[0x41] = '\0';
  local_d8[0x42] = '\0';
  local_d8[0x43] = '\0';
  local_d8[0x44] = '\0';
  local_d8[0x45] = '\0';
  local_d8[0x46] = '\0';
  local_d8[0x47] = '\0';
  local_d8[0x48] = '\0';
  local_d8[0x49] = '\0';
  local_d8[0x4a] = '\0';
  local_d8[0x4b] = '\0';
  local_d8[0x4c] = '\0';
  local_d8[0x4d] = '\0';
  local_d8[0x4e] = '\0';
  local_d8[0x4f] = '\0';
  local_d8[0x30] = '\0';
  local_d8[0x31] = '\0';
  local_d8[0x32] = '\0';
  local_d8[0x33] = '\0';
  local_d8[0x34] = '\0';
  local_d8[0x35] = '\0';
  local_d8[0x36] = '\0';
  local_d8[0x37] = '\0';
  local_d8[0x38] = '\0';
  local_d8[0x39] = '\0';
  local_d8[0x3a] = '\0';
  local_d8[0x3b] = '\0';
  local_d8[0x3c] = '\0';
  local_d8[0x3d] = '\0';
  local_d8[0x3e] = '\0';
  local_d8[0x3f] = '\0';
  local_d8[0x20] = '\0';
  local_d8[0x21] = '\0';
  local_d8[0x22] = '\0';
  local_d8[0x23] = '\0';
  local_d8[0x24] = '\0';
  local_d8[0x25] = '\0';
  local_d8[0x26] = '\0';
  local_d8[0x27] = '\0';
  local_d8[0x28] = '\0';
  local_d8[0x29] = '\0';
  local_d8[0x2a] = '\0';
  local_d8[0x2b] = '\0';
  local_d8[0x2c] = '\0';
  local_d8[0x2d] = '\0';
  local_d8[0x2e] = '\0';
  local_d8[0x2f] = '\0';
  local_d8[0x10] = '\0';
  local_d8[0x11] = '\0';
  local_d8[0x12] = '\0';
  local_d8[0x13] = '\0';
  local_d8[0x14] = '\0';
  local_d8[0x15] = '\0';
  local_d8[0x16] = '\0';
  local_d8[0x17] = '\0';
  local_d8[0x18] = '\0';
  local_d8[0x19] = '\0';
  local_d8[0x1a] = '\0';
  local_d8[0x1b] = '\0';
  local_d8[0x1c] = '\0';
  local_d8[0x1d] = '\0';
  local_d8[0x1e] = '\0';
  local_d8[0x1f] = '\0';
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\0';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  local_d8[8] = '\0';
  local_d8[9] = '\0';
  local_d8[10] = '\0';
  local_d8[0xb] = '\0';
  local_d8[0xc] = '\0';
  local_d8[0xd] = '\0';
  local_d8[0xe] = '\0';
  local_d8[0xf] = '\0';
  ctx->metal_need_header_math = 1;
  if (iVar1 == 3) {
    make_METAL_destarg_assign
              (ctx,local_d8,0x80,"float2(cos(%s), sin(%s))",local_d8 + 0x80,local_d8 + 0x80);
  }
  else {
    if (iVar1 == 2) {
      fmt = "sin(%s)";
    }
    else {
      if (iVar1 != 1) goto LAB_00114299;
      fmt = "cos(%s)";
    }
    make_METAL_destarg_assign(ctx,local_d8,0x80,fmt,local_d8 + 0x80);
  }
LAB_00114299:
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_METAL_SINCOS(Context *ctx)
{
    // we don't care about the temp registers that <= sm2 demands; ignore them.
    //  sm2 also talks about what components are left untouched vs. undefined,
    //  but we just leave those all untouched with Metal write masks (which
    //  would fulfill the "undefined" requirement, too).
    const int mask = ctx->dest_arg.writemask;
    char src0[64]; make_METAL_srcarg_string_scalar(ctx, 0, src0, sizeof (src0));
    char code[128] = { '\0' };

    ctx->metal_need_header_math = 1;
    if (writemask_x(mask))
        make_METAL_destarg_assign(ctx, code, sizeof (code), "cos(%s)", src0);
    else if (writemask_y(mask))
        make_METAL_destarg_assign(ctx, code, sizeof (code), "sin(%s)", src0);
    else if (writemask_xy(mask))
    {
        // !!! FIXME: can use sincos(), but need to assign cos to a temp, since it needs a reference.
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                 "float2(cos(%s), sin(%s))", src0, src0);
    } // else if

    output_line(ctx, "%s", code);
}